

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O3

void test_wrong_opcode_in_fragment(void)

{
  anon_struct_4_7_799a2f31_for_ws_flags *paVar1;
  cio_websocket *websocket;
  _Bool _Var2;
  cio_error cVar3;
  long actual;
  char data [12];
  undefined8 local_b8;
  undefined4 local_b0;
  ws_frame local_a8;
  undefined8 local_88;
  undefined1 *local_80;
  undefined8 local_78;
  undefined2 local_70;
  undefined8 local_68;
  undefined1 *local_60;
  undefined8 local_58;
  undefined2 local_50;
  undefined8 local_48;
  undefined1 *local_40;
  undefined8 local_38;
  undefined2 local_30;
  undefined4 local_28;
  undefined8 local_24;
  undefined8 uStack_1c;
  undefined4 local_14;
  undefined2 local_10;
  
  local_a8.data = &local_b8;
  local_80 = (undefined1 *)&local_b8;
  local_60 = (undefined1 *)&local_b8;
  local_40 = (undefined1 *)&local_b8;
  local_b8 = 0x6161616161616161;
  local_b0 = 0x61616161;
  local_a8.frame_type = CIO_WEBSOCKET_TEXT_FRAME;
  local_a8.direction = FROM_CLIENT;
  local_a8.data_length = 0xc;
  local_a8.last_frame = false;
  local_a8.rsv = false;
  local_88 = 0;
  local_78 = 0xc;
  local_70 = 1;
  local_68 = 0;
  local_58 = 0xc;
  local_50 = 0;
  local_48 = 1;
  local_38 = 0xc;
  local_30 = 1;
  local_28 = 8;
  local_24 = 0;
  uStack_1c = 0;
  local_14 = 0;
  local_10 = 1;
  serialize_frames(&local_a8,5);
  websocket = ws;
  paVar1 = &(ws->ws_private).ws_flags;
  *(ushort *)paVar1 = *(ushort *)paVar1 | 0x400;
  cVar3 = cio_websocket_read_message(websocket,read_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar3,"Could not start reading a message!",0x676,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (3,(ulong)read_handler_fake.call_count,"read_handler was not called",0x678,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)read_handler_fake.arg0_history[2],
             "websocket parameter of read_handler not correct",0x67a,UNITY_DISPLAY_STYLE_HEX64);
  if (read_handler_fake.arg1_history[2] != (void *)0x0) {
    UnityFail("context parameter of read_handler not correct",0x67b);
  }
  UnityAssertEqualNumber
            (1,(long)read_handler_fake.arg2_history[2],"err parameter of read_handler not correct",
             0x67c,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)on_error_fake.call_count,"error callback was called",0x67e,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)on_error_fake.arg0_val,
             "ws parameter in first fragment of error callback not correct",0x67f,
             UNITY_DISPLAY_STYLE_INT);
  actual = (long)on_error_fake.arg1_val;
  UnityAssertEqualNumber
            (-0x5d,actual,"status parameter in error callback not correct",0x680,
             UNITY_DISPLAY_STYLE_INT);
  _Var2 = is_close_frame(0x3ea,SUB81(actual,0));
  if (_Var2) {
    return;
  }
  UnityFail("written frame is not a close frame!",0x681);
}

Assistant:

static void test_wrong_opcode_in_fragment(void)
{
	char data[12];
	memset(data, 'a', sizeof(data));

	struct ws_frame frames[] = {
	    {.frame_type = CIO_WEBSOCKET_TEXT_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = false, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_CONTINUATION_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = true, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_CONTINUATION_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = false, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_TEXT_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = true, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = FROM_CLIENT, .data = NULL, .data_length = 0, .last_frame = true, .rsv = false},
	};

	serialize_frames(frames, ARRAY_SIZE(frames));

	ws->ws_private.ws_flags.is_server = (frames[0].direction == FROM_CLIENT) ? 1 : 0;
	enum cio_error err = cio_websocket_read_message(ws, read_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");

	TEST_ASSERT_EQUAL_MESSAGE(3, read_handler_fake.call_count, "read_handler was not called");

	TEST_ASSERT_EQUAL_PTR_MESSAGE(ws, read_handler_fake.arg0_history[2], "websocket parameter of read_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_history[2], "context parameter of read_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_EOF, read_handler_fake.arg2_history[2], "err parameter of read_handler not correct");

	TEST_ASSERT_EQUAL_MESSAGE(1, on_error_fake.call_count, "error callback was called");
	TEST_ASSERT_EQUAL_MESSAGE(ws, on_error_fake.arg0_val, "ws parameter in first fragment of error callback not correct");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_PROTOCOL_NOT_SUPPORTED, on_error_fake.arg1_val, "status parameter in error callback not correct");
	TEST_ASSERT_MESSAGE(is_close_frame(CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR, true), "written frame is not a close frame!");
}